

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::abc::abc(abc *this,char *name)

{
  undefined8 uVar1;
  int iVar2;
  exc *this_00;
  undefined8 *puVar3;
  float *pfVar4;
  long *plVar5;
  impl *piVar6;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  long lVar7;
  float fVar8;
  unpolarized local_40;
  undefined4 extraout_var;
  
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_00202560;
  (this->m_fresnel).m_f = (impl *)0x0;
  this->m_data = (data *)0x0;
  lVar7 = 0;
  do {
    __fn = (__fn *)name;
    iVar2 = strcmp(*(char **)((long)&s_data + lVar7),name);
    if (iVar2 == 0) {
      this->m_data = (data *)((long)&s_data + lVar7);
      fVar8 = (float)*(double *)((long)&DAT_00200658 + lVar7);
      puVar3 = (undefined8 *)operator_new(0xc);
      *(undefined4 *)(puVar3 + 1) = 0;
      *puVar3 = 0;
      pfVar4 = (float *)operator_new(0xc);
      *pfVar4 = fVar8;
      pfVar4[1] = fVar8;
      pfVar4[2] = fVar8;
      operator_delete(puVar3);
      local_40.super_impl._vptr_impl = (_func_int **)&PTR_clone_002026f0;
      local_40.ior._M_size = 3;
      local_40.ior._M_data = (float *)operator_new(0xc);
      local_40.ior._M_data[2] = pfVar4[2];
      uVar1 = *(undefined8 *)pfVar4;
      *(undefined8 *)local_40.ior._M_data = uVar1;
      iVar2 = fresnel::unpolarized::clone(&local_40,__fn,__child_stack,(int)uVar1,in_R8);
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      piVar6 = (this->m_fresnel).m_f;
      if (piVar6 != (impl *)0x0) {
        (*piVar6->_vptr_impl[2])();
      }
      piVar6 = (impl *)(**(code **)*plVar5)(plVar5);
      (this->m_fresnel).m_f = piVar6;
      (**(code **)(*plVar5 + 0x10))(plVar5);
      local_40.super_impl._vptr_impl = (_func_int **)&PTR_clone_002026f0;
      operator_delete(local_40.ior._M_data);
      operator_delete(pfVar4);
      return;
    }
    lVar7 = lVar7 + 0x50;
  } while (lVar7 != 8000);
  this_00 = (exc *)__cxa_allocate_exception(0x28);
  exc::exc(this_00,"djb_error: No ABC parameters for %s\n",name);
  __cxa_throw(this_00,&exc::typeinfo,exc::~exc);
}

Assistant:

abc::abc(const char *name): m_fresnel(), m_data(NULL)
{
	bool found = false;

	for (int i = 0; i < (int)(sizeof(abc::s_data) / sizeof(abc::data)); ++i) {
		if (!strcmp(s_data[i].name, name)) {
			m_data = &s_data[i];
			brdf::value_type ior(m_data->ior, zero_value().size());
			m_fresnel = fresnel::ptr(fresnel::unpolarized(ior));
			found = true;
			break;
		}
	}
	if (!found) throw exc("djb_error: No ABC parameters for %s\n", name);
}